

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGjkEpa2.cpp
# Opt level: O2

sFace * __thiscall gjkepa2_impl::EPA::findbest(EPA *this)

{
  undefined1 auVar1 [16];
  float fVar2;
  sFace *psVar3;
  sFace *psVar4;
  float fVar5;
  undefined1 auVar6 [64];
  
  psVar4 = (this->m_hull).root;
  auVar6 = ZEXT464((uint)(psVar4->d * psVar4->d));
  psVar3 = psVar4;
  while (psVar4 = psVar4->l[1], psVar4 != (sFace *)0x0) {
    fVar2 = psVar4->d * psVar4->d;
    fVar5 = auVar6._0_4_;
    auVar1 = vminss_avx(ZEXT416((uint)fVar2),auVar6._0_16_);
    auVar6 = ZEXT1664(auVar1);
    if (fVar2 < fVar5) {
      psVar3 = psVar4;
    }
  }
  return psVar3;
}

Assistant:

sFace* findbest()
	{
		sFace* minf = m_hull.root;
		cbtScalar mind = minf->d * minf->d;
		for (sFace* f = minf->l[1]; f; f = f->l[1])
		{
			const cbtScalar sqd = f->d * f->d;
			if (sqd < mind)
			{
				minf = f;
				mind = sqd;
			}
		}
		return (minf);
	}